

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O1

Member * __thiscall rsg::VariableType::Member::operator=(Member *this,Member *other)

{
  VariableType *pVVar1;
  VariableType *this_00;
  
  if (this != other) {
    pVVar1 = this->m_type;
    if (pVVar1 != (VariableType *)0x0) {
      ~VariableType(pVVar1);
      operator_delete(pVVar1,0x50);
    }
    this->m_type = (VariableType *)0x0;
    std::__cxx11::string::_M_assign((string *)&this->m_name);
    pVVar1 = other->m_type;
    if (pVVar1 != (VariableType *)0x0) {
      this_00 = (VariableType *)operator_new(0x50);
      VariableType(this_00,pVVar1);
      this->m_type = this_00;
    }
  }
  return this;
}

Assistant:

Member& operator= (const Member& other)
		{
			if (this == &other)
				return *this;

			delete m_type;

			m_type = DE_NULL;
			m_name = other.m_name;

			if (other.m_type)
				m_type = new VariableType(*other.m_type);

			return *this;
		}